

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O0

bool tinyxml2::XMLUtil::StringEqual(char *p,char *q,int nChar)

{
  bool bVar1;
  int n;
  int nChar_local;
  char *q_local;
  char *p_local;
  bool local_1;
  
  if (p == q) {
    local_1 = true;
  }
  else {
    n = 0;
    q_local = q;
    p_local = p;
    while( true ) {
      bVar1 = false;
      if (((*p_local != '\0') && (bVar1 = false, *q_local != '\0')) &&
         (bVar1 = false, *p_local == *q_local)) {
        bVar1 = n < nChar;
      }
      if (!bVar1) break;
      p_local = p_local + 1;
      q_local = q_local + 1;
      n = n + 1;
    }
    if ((n == nChar) || ((*p_local == '\0' && (*q_local == '\0')))) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

inline static bool StringEqual( const char* p, const char* q, int nChar=INT_MAX )  {
        if ( p == q ) {
            return true;
        }
        int n = 0;
        while( *p && *q && *p == *q && n<nChar ) {
            ++p;
            ++q;
            ++n;
        }
        if ( (n == nChar) || ( *p == 0 && *q == 0 ) ) {
            return true;
        }
        return false;
    }